

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O1

bool __thiscall
YAML::Utils::WriteTagWithPrefix(Utils *this,ostream_wrapper *out,string *prefix,string *tag)

{
  uint uVar1;
  uint uVar2;
  RegEx *pRVar3;
  int iVar4;
  pointer pRVar5;
  RegEx *param;
  long lVar6;
  RegEx *pRVar7;
  ulong uVar8;
  StringCharSource tagBuffer;
  StringCharSource prefixBuffer;
  char local_69;
  StringCharSource local_68;
  StringCharSource local_50;
  string *local_38;
  
  local_38 = prefix;
  ostream_wrapper::write((ostream_wrapper *)this,0x761b19,(void *)0x1,(size_t)tag);
  local_50.m_str =
       (out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.m_size =
       (size_t)(out->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
  local_50.m_offset = 0;
  while (local_50.m_offset < local_50.m_size) {
    pRVar3 = Exp::URI();
    uVar1 = 0xffffffff;
    uVar2 = uVar1;
    if (local_50.m_offset < local_50.m_size || pRVar3->m_op - REGEX_OR < 0xfffffffe) {
      switch(pRVar3->m_op) {
      case REGEX_EMPTY:
        uVar2 = -(uint)(local_50.m_offset < local_50.m_size);
        break;
      case REGEX_MATCH:
        uVar2 = (uint)(local_50.m_str[local_50.m_offset] == pRVar3->m_a) * 2 - 1;
        break;
      case REGEX_RANGE:
        uVar2 = -(uint)(pRVar3->m_z < local_50.m_str[local_50.m_offset] ||
                       local_50.m_str[local_50.m_offset] < pRVar3->m_a);
LAB_007187df:
        uVar2 = uVar2 | 1;
        break;
      case REGEX_OR:
        pRVar7 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pRVar3 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        while ((uVar2 = uVar1, pRVar7 != pRVar3 &&
               (uVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar7,&local_50),
               (int)uVar2 < 0))) {
          pRVar7 = pRVar7 + 1;
        }
        break;
      case REGEX_AND:
        pRVar5 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
            .super__Vector_impl_data._M_finish != pRVar5) {
          lVar6 = 0;
          uVar8 = 0;
          uVar2 = 0xffffffff;
          do {
            uVar1 = RegEx::MatchUnchecked<YAML::StringCharSource>
                              ((RegEx *)((long)&pRVar5->m_op + lVar6),&local_50);
            if (uVar1 == 0xffffffff) {
              uVar2 = 0xffffffff;
              break;
            }
            if (uVar8 == 0) {
              uVar2 = uVar1;
            }
            uVar8 = uVar8 + 1;
            pRVar5 = (pRVar3->m_params).
                     super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar6 = lVar6 + 0x20;
          } while (uVar8 < (ulong)((long)(pRVar3->m_params).
                                         super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5
                                  >> 5));
        }
        break;
      case REGEX_NOT:
        pRVar7 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pRVar7 != (pRVar3->m_params).
                      super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          uVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar7,&local_50);
          uVar2 = (int)~uVar2 >> 0x1f;
          goto LAB_007187df;
        }
        break;
      case REGEX_SEQ:
        uVar2 = RegEx::MatchOpSeq<YAML::StringCharSource>(pRVar3,&local_50);
      }
    }
    if ((int)uVar2 < 1) {
      return false;
    }
    iVar4 = uVar2 + 1;
    do {
      local_68.m_str = (char *)CONCAT71(local_68.m_str._1_7_,local_50.m_str[local_50.m_offset]);
      tag = (string *)local_50.m_offset;
      ostream_wrapper::write((ostream_wrapper *)this,(int)&local_68,(void *)0x1,local_50.m_offset);
      local_50.m_offset = (long)&((_Alloc_hider *)local_50.m_offset)->_M_p + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
    if ((int)uVar2 < 1) {
      return false;
    }
  }
  ostream_wrapper::write((ostream_wrapper *)this,0x761b19,(void *)0x1,(size_t)tag);
  local_68.m_str = (local_38->_M_dataplus)._M_p;
  local_68.m_size = local_38->_M_string_length;
  local_68.m_offset = 0;
  do {
    local_38 = (string *)
               CONCAT44(local_38._4_4_,
                        (int)CONCAT71((int7)(local_68.m_offset >> 8),
                                      local_68.m_size <= local_68.m_offset));
    if (local_68.m_size <= local_68.m_offset) break;
    pRVar3 = Exp::Tag();
    uVar1 = 0xffffffff;
    uVar2 = uVar1;
    if (local_68.m_offset < local_68.m_size || pRVar3->m_op - REGEX_OR < 0xfffffffe) {
      switch(pRVar3->m_op) {
      case REGEX_EMPTY:
        uVar2 = -(uint)(local_68.m_offset < local_68.m_size);
        break;
      case REGEX_MATCH:
        uVar2 = (uint)(local_68.m_str[local_68.m_offset] == pRVar3->m_a) * 2 - 1;
        break;
      case REGEX_RANGE:
        uVar2 = -(uint)(pRVar3->m_z < local_68.m_str[local_68.m_offset] ||
                       local_68.m_str[local_68.m_offset] < pRVar3->m_a);
LAB_007189d0:
        uVar2 = uVar2 | 1;
        break;
      case REGEX_OR:
        pRVar7 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pRVar3 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        while ((uVar2 = uVar1, pRVar7 != pRVar3 &&
               (uVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar7,&local_68),
               (int)uVar2 < 0))) {
          pRVar7 = pRVar7 + 1;
        }
        break;
      case REGEX_AND:
        pRVar5 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl
            .super__Vector_impl_data._M_finish != pRVar5) {
          lVar6 = 0;
          uVar8 = 0;
          uVar2 = 0xffffffff;
          do {
            uVar1 = RegEx::MatchUnchecked<YAML::StringCharSource>
                              ((RegEx *)((long)&pRVar5->m_op + lVar6),&local_68);
            if (uVar1 == 0xffffffff) {
              uVar2 = 0xffffffff;
              break;
            }
            if (uVar8 == 0) {
              uVar2 = uVar1;
            }
            uVar8 = uVar8 + 1;
            pRVar5 = (pRVar3->m_params).
                     super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar6 = lVar6 + 0x20;
          } while (uVar8 < (ulong)((long)(pRVar3->m_params).
                                         super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5
                                  >> 5));
        }
        break;
      case REGEX_NOT:
        pRVar7 = (pRVar3->m_params).super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (pRVar7 != (pRVar3->m_params).
                      super__Vector_base<YAML::RegEx,_std::allocator<YAML::RegEx>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
          uVar2 = RegEx::MatchUnchecked<YAML::StringCharSource>(pRVar7,&local_68);
          uVar2 = (int)~uVar2 >> 0x1f;
          goto LAB_007189d0;
        }
        break;
      case REGEX_SEQ:
        uVar2 = RegEx::MatchOpSeq<YAML::StringCharSource>(pRVar3,&local_68);
      }
    }
    if ((int)uVar2 < 1) break;
    iVar4 = uVar2 + 1;
    do {
      local_69 = local_68.m_str[local_68.m_offset];
      ostream_wrapper::write((ostream_wrapper *)this,(int)&local_69,(void *)0x1,local_68.m_offset);
      local_68.m_offset = local_68.m_offset + 1;
      iVar4 = iVar4 + -1;
    } while (1 < iVar4);
  } while (0 < (int)uVar2);
  return (bool)local_38._0_1_;
}

Assistant:

bool WriteTagWithPrefix(ostream_wrapper& out, const std::string& prefix,
                        const std::string& tag) {
  out << "!";
  StringCharSource prefixBuffer(prefix.c_str(), prefix.size());
  while (prefixBuffer) {
    int n = Exp::URI().Match(prefixBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << prefixBuffer[0];
      ++prefixBuffer;
    }
  }

  out << "!";
  StringCharSource tagBuffer(tag.c_str(), tag.size());
  while (tagBuffer) {
    int n = Exp::Tag().Match(tagBuffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << tagBuffer[0];
      ++tagBuffer;
    }
  }
  return true;
}